

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetTapBranchData(void *handle,void *tree_handle,uint8_t index_from_leaf,bool is_root_data,
                       char **branch_hash,uint8_t *leaf_version,char **tapscript,
                       uint8_t *depth_by_leaf_or_end)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  uint8_t uVar2;
  reference this_00;
  reference object;
  char *pcVar3;
  char *pcVar4;
  CfdException *this_01;
  uint8_t uVar5;
  bool bVar6;
  char *work_branch_hash;
  char *work_tapscript;
  Script local_130;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  ByteData256 hash_obj;
  string local_c8;
  TapBranch branch_data;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&branch_data,"TapscriptTree",(allocator *)&local_130);
  cfd::capi::CheckBuffer(tree_handle,(string *)&branch_data);
  std::__cxx11::string::~string((string *)&branch_data);
  this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
          ((long)tree_handle + 0x18);
  if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                   **)((long)tree_handle + 0x10),0);
  }
  else {
    this_00 = (reference)
              std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
  }
  cfd::core::ByteData256::ByteData256(&hash_obj);
  cfd::core::TapBranch::TapBranch(&branch_data);
  cfd::core::TapBranch::GetBranchList(&branches,&this_00->super_TapBranch);
  if ((uint)index_from_leaf <
      (uint)(((long)branches.
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)branches.
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x78)) {
    if (is_root_data) {
      cfd::core::TapBranch::GetBranchHash
                ((ByteData256 *)&local_130,&this_00->super_TapBranch,index_from_leaf);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_obj,&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130);
      bVar6 = tapscript != (char **)0x0;
      pcVar3 = (char *)0x0;
      uVar5 = '\0';
      bVar1 = false;
    }
    else {
      object = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                         (&branches,(ulong)index_from_leaf);
      cfd::core::TapBranch::operator=(&branch_data,object);
      cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&local_130,&branch_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_obj,&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130);
      bVar1 = cfd::core::TapBranch::HasTapLeaf(&branch_data);
      cfd::core::TapBranch::GetBranchList
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_130,
                 &branch_data);
      uVar5 = (uint8_t)((CONCAT44(local_130.script_data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_130.script_data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) -
                        (long)local_130._vptr_Script) / 0x78);
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_130);
      bVar6 = tapscript != (char **)0x0;
      if (bVar6 && bVar1) {
        cfd::core::TapBranch::GetScript(&local_130,&branch_data);
        cfd::core::Script::GetHex_abi_cxx11_(&local_c8,&local_130);
        pcVar3 = cfd::capi::CreateString(&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        cfd::core::Script::~Script(&local_130);
        bVar6 = true;
        bVar1 = true;
      }
      else {
        pcVar3 = (char *)0x0;
      }
    }
    if (branch_hash == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_130,&hash_obj);
      pcVar4 = cfd::capi::CreateString((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    if (leaf_version != (uint8_t *)0x0) {
      if (bVar1 == false) {
        uVar2 = '\0';
      }
      else {
        uVar2 = cfd::core::TapBranch::GetLeafVersion(&branch_data);
      }
      *leaf_version = uVar2;
    }
    if (depth_by_leaf_or_end != (uint8_t *)0x0) {
      *depth_by_leaf_or_end = uVar5;
    }
    if (bVar6) {
      *tapscript = pcVar3;
    }
    if (branch_hash != (char **)0x0) {
      *branch_hash = pcVar4;
    }
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&branches);
    cfd::core::TapBranch::~TapBranch(&branch_data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_obj);
    return 0;
  }
  local_130._vptr_Script = (_func_int **)0x4fb1b0;
  local_130.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3a0;
  local_130.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetTapBranchData";
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_130,"index_from_leaf is out of range.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_130,"Failed to parameter. index_from_leaf is out of range.",
             (allocator *)&local_c8);
  cfd::core::CfdException::CfdException(this_01,kCfdOutOfRangeError,(string *)&local_130);
  __cxa_throw(this_01,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTapBranchData(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    bool is_root_data, char** branch_hash, uint8_t* leaf_version,
    char** tapscript, uint8_t* depth_by_leaf_or_end) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_branch_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    ByteData256 hash_obj;
    TapBranch branch_data;
    bool has_leaf = false;
    uint8_t branch_count = 0;
    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    if (is_root_data) {
      hash_obj = branch->GetBranchHash(index_from_leaf);
    } else {
      branch_data = branches.at(index_from_leaf);
      hash_obj = branch_data.GetCurrentBranchHash();
      has_leaf = branch_data.HasTapLeaf();
      branch_count = static_cast<uint8_t>(branch_data.GetBranchList().size());
    }

    if (has_leaf && (tapscript != nullptr)) {
      work_tapscript = CreateString(branch_data.GetScript().GetHex());
    }
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    if (leaf_version != nullptr) {
      *leaf_version = (has_leaf) ? branch_data.GetLeafVersion() : 0;
    }
    if (depth_by_leaf_or_end != nullptr) *depth_by_leaf_or_end = branch_count;
    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_branch_hash);
  return result;
}